

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

string_view google::protobuf::internal::FindName(char *name_data,size_t entries,size_t index)

{
  unsigned_long uVar1;
  char *start;
  size_t size;
  size_t pos;
  uint8_t *uint8s;
  size_t num_sizes;
  size_t index_local;
  size_t entries_local;
  char *name_data_local;
  
  uVar1 = std::accumulate<unsigned_char_const*,unsigned_long>
                    ((uchar *)name_data,(uchar *)(name_data + index),
                     entries + 7 & 0xfffffffffffffff8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&name_data_local,name_data + uVar1,
             (long)name_data[index]);
  return _name_data_local;
}

Assistant:

static absl::string_view FindName(const char* name_data, size_t entries,
                                  size_t index) {
  // The compiler unrolls these... if this isn't fast enough,
  // there's an AVX version at https://godbolt.org/z/eojrjqzfr
  // ARM-compatible version at https://godbolt.org/z/n5YT5Ee85

  // The field name sizes are padded up to a multiple of 8, so we
  // must pad them here.
  size_t num_sizes = (entries + 7) & -8;
  auto* uint8s = reinterpret_cast<const uint8_t*>(name_data);
  size_t pos = std::accumulate(uint8s, uint8s + index, num_sizes);
  size_t size = name_data[index];
  auto* start = &name_data[pos];
  return {start, size};
}